

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Locale.cpp
# Opt level: O0

void __thiscall f8n::i18n::Locale::Locale(Locale *this)

{
  element_type *peVar1;
  allocator<char> local_99;
  string local_98 [39];
  allocator<char> local_71;
  string local_70 [32];
  string local_50 [48];
  shared_ptr<f8n::prefs::Preferences> local_20;
  Locale *local_10;
  Locale *this_local;
  
  local_10 = this;
  sigslot::
  signal1<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sigslot::multi_threaded_local>
  ::signal1(&this->LocaleChanged);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->locales);
  std::shared_ptr<f8n::prefs::Preferences>::shared_ptr(&this->prefs);
  std::__cxx11::string::string((string *)&this->selectedLocale);
  std::__cxx11::string::string((string *)&this->localePath);
  nlohmann::json_abi_v3_11_2::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::basic_json(&this->localeData,(nullptr_t)0x0);
  nlohmann::json_abi_v3_11_2::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::basic_json(&this->defaultLocaleData,(nullptr_t)0x0);
  env::GetDefaultPreferences();
  std::shared_ptr<f8n::prefs::Preferences>::operator=(&this->prefs,&local_20);
  std::shared_ptr<f8n::prefs::Preferences>::~shared_ptr(&local_20);
  peVar1 = std::
           __shared_ptr_access<f8n::prefs::Preferences,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<f8n::prefs::Preferences,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&this->prefs);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_70,"default",&local_71);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_98,"en_US",&local_99);
  (*(peVar1->super_IPreferences)._vptr_IPreferences[0xd])(local_50,peVar1,local_70,local_98);
  std::__cxx11::string::operator=((string *)&this->selectedLocale,local_50);
  std::__cxx11::string::~string(local_50);
  std::__cxx11::string::~string(local_98);
  std::allocator<char>::~allocator(&local_99);
  std::__cxx11::string::~string(local_70);
  std::allocator<char>::~allocator(&local_71);
  return;
}

Assistant:

Locale::Locale() {
    this->prefs = GetDefaultPreferences();
    this->selectedLocale = prefs->GetString(PREFERENCE_KEY_LOCALE, DEFAULT_LOCALE);
}